

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

solution_t solve(deck_t *f,deck_t *s)

{
  deck_t *pdVar1;
  bool bVar2;
  bool bVar3;
  reference pCVar4;
  reference pCVar5;
  ostream *poVar6;
  reference pCVar7;
  runtime_error *this;
  int local_1b0 [4];
  _List_iterator<CCard> local_1a0;
  _List_const_iterator<CCard> local_198;
  _List_node_base *local_190;
  _List_iterator<CCard> local_188;
  _List_const_iterator<CCard> local_180;
  iterator local_178;
  iterator i;
  _List_const_iterator<CCard> local_168;
  _List_node_base *local_160;
  iterator local_158;
  _List_const_iterator<CCard> local_150;
  _List_node_base *local_148;
  iterator local_140;
  _List_const_iterator<CCard> local_138;
  _List_node_base *local_130;
  iterator local_128;
  _List_const_iterator<CCard> local_120;
  _List_node_base *local_118;
  iterator local_110;
  _List_const_iterator<CCard> local_108;
  _List_node_base *local_100;
  iterator local_f8;
  _List_const_iterator<CCard> local_f0;
  _List_node_base *local_e8;
  iterator local_e0;
  _List_const_iterator<CCard> local_d8;
  _List_node_base *local_d0;
  iterator local_c8;
  _List_const_iterator<CCard> local_c0;
  _List_node_base *local_b8;
  iterator local_b0;
  _List_const_iterator<CCard> local_a8;
  const_iterator c2;
  _List_const_iterator<CCard> local_98;
  const_iterator c1;
  string local_88;
  allocator<char> local_51;
  string local_50;
  deck_t *local_30;
  deck_t *winner;
  deck_t *pdStack_20;
  int turn;
  deck_t *s_local;
  deck_t *f_local;
  
  winner._4_4_ = 0;
  pdStack_20 = s;
  s_local = f;
  do {
    local_30 = (deck_t *)0x0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"deck 1",&local_51);
    dump_deck(&local_50,f);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"deck 2",(allocator<char> *)((long)&c1._M_node + 7));
    dump_deck(&local_88,s);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator((allocator<char> *)((long)&c1._M_node + 7));
    c2._M_node = (_List_node_base *)std::__cxx11::list<CCard,_std::allocator<CCard>_>::begin(f);
    std::_List_const_iterator<CCard>::_List_const_iterator(&local_98,(iterator *)&c2);
    local_b0._M_node =
         (_List_node_base *)std::__cxx11::list<CCard,_std::allocator<CCard>_>::begin(s);
    std::_List_const_iterator<CCard>::_List_const_iterator(&local_a8,&local_b0);
    do {
      pCVar4 = std::_List_const_iterator<CCard>::operator*(&local_98);
      pCVar5 = std::_List_const_iterator<CCard>::operator*(&local_a8);
      bVar2 = CCard::operator<(pCVar4,pCVar5);
      pdVar1 = s;
      if (!bVar2) {
        pCVar4 = std::_List_const_iterator<CCard>::operator*(&local_a8);
        pCVar5 = std::_List_const_iterator<CCard>::operator*(&local_98);
        bVar2 = CCard::operator<(pCVar4,pCVar5);
        pdVar1 = f;
        if (!bVar2) {
          local_b8 = (_List_node_base *)std::_List_const_iterator<CCard>::operator++(&local_98,0);
          local_c8._M_node =
               (_List_node_base *)std::__cxx11::list<CCard,_std::allocator<CCard>_>::end(f);
          std::_List_const_iterator<CCard>::_List_const_iterator(&local_c0,&local_c8);
          bVar2 = std::operator==(&local_c0,&local_98);
          if (bVar2) break;
          local_d0 = (_List_node_base *)std::_List_const_iterator<CCard>::operator++(&local_98,0);
          local_e0._M_node =
               (_List_node_base *)std::__cxx11::list<CCard,_std::allocator<CCard>_>::end(f);
          std::_List_const_iterator<CCard>::_List_const_iterator(&local_d8,&local_e0);
          bVar2 = std::operator==(&local_d8,&local_98);
          if (bVar2) break;
          local_e8 = (_List_node_base *)std::_List_const_iterator<CCard>::operator++(&local_98,0);
          local_f8._M_node =
               (_List_node_base *)std::__cxx11::list<CCard,_std::allocator<CCard>_>::end(f);
          std::_List_const_iterator<CCard>::_List_const_iterator(&local_f0,&local_f8);
          bVar2 = std::operator==(&local_f0,&local_98);
          if (bVar2) break;
          local_100 = (_List_node_base *)std::_List_const_iterator<CCard>::operator++(&local_98,0);
          local_110._M_node =
               (_List_node_base *)std::__cxx11::list<CCard,_std::allocator<CCard>_>::end(f);
          std::_List_const_iterator<CCard>::_List_const_iterator(&local_108,&local_110);
          bVar2 = std::operator==(&local_108,&local_98);
          if (bVar2) break;
          local_118 = (_List_node_base *)std::_List_const_iterator<CCard>::operator++(&local_a8,0);
          local_128._M_node =
               (_List_node_base *)std::__cxx11::list<CCard,_std::allocator<CCard>_>::end(s);
          std::_List_const_iterator<CCard>::_List_const_iterator(&local_120,&local_128);
          bVar2 = std::operator==(&local_120,&local_a8);
          if (bVar2) break;
          local_130 = (_List_node_base *)std::_List_const_iterator<CCard>::operator++(&local_a8,0);
          local_140._M_node =
               (_List_node_base *)std::__cxx11::list<CCard,_std::allocator<CCard>_>::end(s);
          std::_List_const_iterator<CCard>::_List_const_iterator(&local_138,&local_140);
          bVar2 = std::operator==(&local_138,&local_a8);
          if (bVar2) break;
          local_148 = (_List_node_base *)std::_List_const_iterator<CCard>::operator++(&local_a8,0);
          local_158._M_node =
               (_List_node_base *)std::__cxx11::list<CCard,_std::allocator<CCard>_>::end(s);
          std::_List_const_iterator<CCard>::_List_const_iterator(&local_150,&local_158);
          bVar2 = std::operator==(&local_150,&local_a8);
          if (bVar2) break;
          local_160 = (_List_node_base *)std::_List_const_iterator<CCard>::operator++(&local_a8,0);
          i = std::__cxx11::list<CCard,_std::allocator<CCard>_>::end(s);
          std::_List_const_iterator<CCard>::_List_const_iterator(&local_168,&i);
          bVar2 = std::operator==(&local_168,&local_a8);
          pdVar1 = local_30;
          if (bVar2) break;
        }
      }
      local_30 = pdVar1;
    } while (local_30 == (deck_t *)0x0);
    winner._4_4_ = winner._4_4_ + 1;
    poVar6 = std::operator<<((ostream *)&std::cerr,"turn #");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,winner._4_4_);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    if (local_30 != (deck_t *)0x0) {
      local_178._M_node =
           (_List_node_base *)std::__cxx11::list<CCard,_std::allocator<CCard>_>::begin(f);
      while( true ) {
        std::_List_const_iterator<CCard>::_List_const_iterator(&local_180,&local_178);
        bVar2 = std::operator!=(&local_180,&local_98);
        pdVar1 = local_30;
        if (!bVar2) break;
        local_188._M_node = (_List_node_base *)std::_List_iterator<CCard>::operator++(&local_178,0);
        pCVar7 = std::_List_iterator<CCard>::operator*(&local_188);
        std::__cxx11::list<CCard,_std::allocator<CCard>_>::push_back(pdVar1,pCVar7);
        std::__cxx11::list<CCard,_std::allocator<CCard>_>::pop_front(f);
      }
      pCVar7 = std::_List_iterator<CCard>::operator*(&local_178);
      std::__cxx11::list<CCard,_std::allocator<CCard>_>::push_back(pdVar1,pCVar7);
      std::__cxx11::list<CCard,_std::allocator<CCard>_>::pop_front(f);
      local_190 = (_List_node_base *)std::__cxx11::list<CCard,_std::allocator<CCard>_>::begin(s);
      local_178._M_node = local_190;
      while( true ) {
        std::_List_const_iterator<CCard>::_List_const_iterator(&local_198,&local_178);
        bVar2 = std::operator!=(&local_198,&local_a8);
        pdVar1 = local_30;
        if (!bVar2) break;
        local_1a0._M_node = (_List_node_base *)std::_List_iterator<CCard>::operator++(&local_178,0);
        pCVar7 = std::_List_iterator<CCard>::operator*(&local_1a0);
        std::__cxx11::list<CCard,_std::allocator<CCard>_>::push_back(pdVar1,pCVar7);
        std::__cxx11::list<CCard,_std::allocator<CCard>_>::pop_front(s);
      }
      pCVar7 = std::_List_iterator<CCard>::operator*(&local_178);
      std::__cxx11::list<CCard,_std::allocator<CCard>_>::push_back(pdVar1,pCVar7);
      std::__cxx11::list<CCard,_std::allocator<CCard>_>::pop_front(s);
    }
    bVar3 = std::__cxx11::list<CCard,_std::allocator<CCard>_>::empty(f);
    bVar2 = false;
    if (!bVar3) {
      bVar3 = std::__cxx11::list<CCard,_std::allocator<CCard>_>::empty(s);
      bVar2 = false;
      if (!bVar3) {
        bVar2 = local_30 != (deck_t *)0x0;
      }
    }
    if (!bVar2) {
      bVar2 = std::__cxx11::list<CCard,_std::allocator<CCard>_>::empty(f);
      if (bVar2) {
        local_1b0[3] = 2;
        std::pair<int,_int>::pair<int,_int_&,_true>
                  ((pair<int,_int> *)&f_local,local_1b0 + 3,(int *)((long)&winner + 4));
      }
      else {
        bVar2 = std::__cxx11::list<CCard,_std::allocator<CCard>_>::empty(s);
        if (bVar2) {
          local_1b0[2] = 1;
          std::pair<int,_int>::pair<int,_int_&,_true>
                    ((pair<int,_int> *)&f_local,local_1b0 + 2,(int *)((long)&winner + 4));
        }
        else {
          if (local_30 != (deck_t *)0x0) {
            this = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this,"Unexpected exit");
            __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          local_1b0[1] = 0;
          local_1b0[0] = 0;
          std::pair<int,_int>::pair<int,_int,_true>
                    ((pair<int,_int> *)&f_local,local_1b0 + 1,local_1b0);
        }
      }
      return (solution_t)f_local;
    }
  } while( true );
}

Assistant:

solution_t solve(deck_t f, deck_t s)
{
    int turn = 0;
    
    deck_t* winner;
    do
    {
        winner = NULL;

        dump_deck("deck 1", f);
        dump_deck("deck 2", s);

        // take first cards (fight)
        deck_t::const_iterator c1 = f.begin();
        deck_t::const_iterator c2 = s.begin();
            
        do
        {
            if (*c1 < *c2)
            {
                // second have won
                winner = &s;
            }
            else if (*c2 < *c1)
            {
                // first have won
                winner = &f;
            }
            else
            {
                // equal. war is going to start
                c1++;
                if (f.end() == c1)
                {
                    break;
                }
                c1++;
                if (f.end() == c1)
                {
                    break;
                }
                c1++;
                if (f.end() == c1)
                {
                    break;
                }
                c1++;
                if (f.end() == c1)
                {
                    break;
                }
                
                c2++;
                if (s.end() == c2)
                {
                    break;
                }
                c2++;
                if (s.end() == c2)
                {
                    break;
                }
                c2++;
                if (s.end() == c2)
                {
                    break;
                }
                c2++;
                if (s.end() == c2)
                {
                    break;
                }
            }
        } while (NULL == winner);
        turn++;
        
        std::cerr << "turn #" << turn << std::endl;

        if (NULL != winner)
        {
            // move card to the winner
            deck_t::iterator i = f.begin();
            while (i != c1)
            {
                winner->push_back(*i++);
                f.pop_front();
            }
            winner->push_back(*i);
            f.pop_front();

            i = s.begin();
            while (i != c2)
            {
                winner->push_back(*i++);
                s.pop_front();
            }
            winner->push_back(*i);
            s.pop_front();
        }
    } while (!f.empty() && !s.empty() && NULL != winner);
    
    if (f.empty())
    {
        return solution_t(2, turn);
    }
    else if (s.empty())
    {
        return solution_t(1, turn);
    }
    else if (NULL == winner)
    {
        return solution_t(0, 0);    // PAT
    }
    else
    {
        throw std::runtime_error("Unexpected exit");
    }
    
    throw std::runtime_error("Wrong logic");
}